

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_compute_branch(DisasContext_conflict14 *ctx,uint32_t opc,int r1,int r2,int32_t constant,
                       int32_t offset)

{
  TCGContext_conflict9 *tcg_ctx_00;
  int16_t address;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 ret;
  TCGv_i32 helper_tmp_1;
  TCGv_i32 helper_tmp;
  int n;
  TCGv_i32 temp2;
  TCGv_i32 temp;
  TCGContext_conflict9 *tcg_ctx;
  int32_t offset_local;
  int32_t constant_local;
  int r2_local;
  int r1_local;
  uint32_t opc_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  address = (int16_t)offset;
  switch(opc) {
  case 6:
  case 9:
    gen_helper_ret(tcg_ctx_00,tcg_ctx_00->cpu_env);
    tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)0x0,0);
    break;
  default:
    generate_trap(ctx,2,1);
    break;
  case 0xe:
    gen_branch_condi(ctx,TCG_COND_LT,tcg_ctx_00->cpu_gpr_d[r1],0,address);
    break;
  case 0x1d:
  case 0x3c:
    gen_goto_tb(ctx,0,(ctx->base).pc_next + offset * 2);
    break;
  case 0x1e:
    gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[0xf],constant,address);
    break;
  case 0x1f:
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    ret = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 1) {
      tcg_gen_mov_i32(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[r1]);
      tcg_gen_mov_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_gpr_d[r2]);
      tcg_gen_subi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r1],1);
      gen_branch_cond(ctx,TCG_COND_NE,pTVar3,ret,address);
    }
    else {
      tcg_gen_mov_i32(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[r1]);
      tcg_gen_mov_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_gpr_d[r2]);
      tcg_gen_addi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r1],1);
      gen_branch_cond(ctx,TCG_COND_NE,pTVar3,ret,address);
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,ret);
    break;
  case 0x2e:
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_andi_i32_tricore
              (tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[0xf],1 << ((byte)constant & 0x1f));
    gen_branch_condi(ctx,TCG_COND_EQ,pTVar3,0,address);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0x3e:
    gen_branch_cond(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[0xf],address);
    break;
  case 0x3f:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_cond(ctx,TCG_COND_LT,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r2],address);
    }
    else {
      gen_branch_cond(ctx,TCG_COND_LTU,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r2],address);
    }
    break;
  case 0x4e:
    gen_branch_condi(ctx,TCG_COND_GT,tcg_ctx_00->cpu_gpr_d[r1],0,address);
    break;
  case 0x5c:
  case 0x6d:
    pTVar3 = tcg_const_i32_tricore(tcg_ctx_00,ctx->pc_succ_insn);
    gen_helper_call(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    gen_goto_tb(ctx,0,(ctx->base).pc_next + offset * 2);
    break;
  case 0x5d:
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_a[0xb],ctx->pc_succ_insn);
    gen_goto_tb(ctx,0,(ctx->base).pc_next + offset * 2);
    break;
  case 0x5e:
    gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[0xf],constant,address);
    break;
  case 0x5f:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_cond(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r2],address);
    }
    else {
      gen_branch_cond(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r2],address);
    }
    break;
  case 0x61:
    gen_fcall_save_ctx(ctx);
    gen_goto_tb(ctx,0,(ctx->base).pc_next + offset * 2);
    break;
  case 0x6e:
    gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[0xf],0,address);
    break;
  case 0x6f:
    uVar1 = extract32(ctx->opcode,0xc,4);
    uVar2 = extract32(ctx->opcode,7,1);
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_andi_i32_tricore
              (tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[r1],
               1 << ((char)uVar1 + (char)uVar2 * '\x10' & 0x1fU));
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 1) {
      gen_branch_condi(ctx,TCG_COND_NE,pTVar3,0,address);
    }
    else {
      gen_branch_condi(ctx,TCG_COND_EQ,pTVar3,0,address);
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0x76:
    gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[r1],0,address);
    break;
  case 0x7c:
    gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_a[r1],0,address);
    break;
  case 0x7d:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_cond(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_a[r1],tcg_ctx_00->cpu_gpr_a[r2],address);
    }
    else {
      gen_branch_cond(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_a[r1],tcg_ctx_00->cpu_gpr_a[r2],address);
    }
    break;
  case 0x7e:
    gen_branch_cond(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[0xf],address);
    break;
  case 0x7f:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_cond(ctx,TCG_COND_GE,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r2],address);
    }
    else {
      gen_branch_cond(ctx,TCG_COND_GEU,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r2],address);
    }
    break;
  case 0x8e:
    gen_branch_condi(ctx,TCG_COND_LE,tcg_ctx_00->cpu_gpr_d[r1],0,address);
    break;
  case 0x9e:
    gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[0xf],constant,address + 0x10);
    break;
  case 0x9f:
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 1) {
      tcg_gen_mov_i32(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[r1]);
      tcg_gen_subi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r1],1);
      gen_branch_condi(ctx,TCG_COND_NE,pTVar3,constant,address);
    }
    else {
      tcg_gen_mov_i32(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[r1]);
      tcg_gen_addi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[r1],1);
      gen_branch_condi(ctx,TCG_COND_NE,pTVar3,constant,address);
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0xae:
    pTVar3 = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_andi_i32_tricore
              (tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_gpr_d[0xf],1 << ((byte)constant & 0x1f));
    gen_branch_condi(ctx,TCG_COND_NE,pTVar3,0,address);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    break;
  case 0xbc:
    gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_a[r1],0,address);
    break;
  case 0xbd:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 1) {
      gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_a[r1],0,address);
    }
    else {
      gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_a[r1],0,address);
    }
    break;
  case 0xbe:
    gen_branch_cond(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[0xf],
                    address + 0x10);
    break;
  case 0xbf:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_condi(ctx,TCG_COND_LT,tcg_ctx_00->cpu_gpr_d[r1],constant,address);
    }
    else {
      uVar1 = extract32(ctx->opcode,0xc,4);
      gen_branch_condi(ctx,TCG_COND_LTU,tcg_ctx_00->cpu_gpr_d[r1],uVar1,address);
    }
    break;
  case 0xce:
    gen_branch_condi(ctx,TCG_COND_GE,tcg_ctx_00->cpu_gpr_d[r1],0,address);
    break;
  case 0xdc:
    tcg_gen_andi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PC,tcg_ctx_00->cpu_gpr_a[r1],-2);
    tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)0x0,0);
    break;
  case 0xdd:
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_a[0xb],ctx->pc_succ_insn);
  case 0x9d:
    gen_goto_tb(ctx,0,(offset & 0xf00000U) << 8 | (offset & 0xfffffU) << 1);
    break;
  case 0xde:
    gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[0xf],constant,address + 0x10);
    break;
  case 0xdf:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_condi(ctx,TCG_COND_EQ,tcg_ctx_00->cpu_gpr_d[r1],constant,address);
    }
    else {
      gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[r1],constant,address);
    }
    break;
  case 0xe1:
    gen_fcall_save_ctx(ctx);
    gen_goto_tb(ctx,0,(offset & 0xf00000U) << 8 | (offset & 0xfffffU) << 1);
    break;
  case 0xed:
    pTVar3 = tcg_const_i32_tricore(tcg_ctx_00,ctx->pc_succ_insn);
    gen_helper_call(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar3);
    tcg_temp_free_i32(tcg_ctx_00,pTVar3);
    gen_goto_tb(ctx,0,(offset & 0xf00000U) << 8 | (offset & 0xfffffU) << 1);
    break;
  case 0xee:
    gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[0xf],0,address);
    break;
  case 0xf6:
    gen_branch_condi(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[r1],0,address);
    break;
  case 0xfc:
    gen_loop(ctx,r1,offset * 2 + -0x20);
    break;
  case 0xfd:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_loop(ctx,r2,offset << 1);
    }
    else {
      gen_goto_tb(ctx,0,(ctx->base).pc_next + offset * 2);
    }
    break;
  case 0xfe:
    gen_branch_cond(ctx,TCG_COND_NE,tcg_ctx_00->cpu_gpr_d[r1],tcg_ctx_00->cpu_gpr_d[0xf],
                    address + 0x10);
    break;
  case 0xff:
    uVar1 = extract32(ctx->opcode,0x1f,1);
    if (uVar1 == 0) {
      gen_branch_condi(ctx,TCG_COND_GE,tcg_ctx_00->cpu_gpr_d[r1],constant,address);
    }
    else {
      uVar1 = extract32(ctx->opcode,0xc,4);
      gen_branch_condi(ctx,TCG_COND_GEU,tcg_ctx_00->cpu_gpr_d[r1],uVar1,address);
    }
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_compute_branch(DisasContext *ctx, uint32_t opc,
                               int insn_bytes,
                               int rs, int rt, int32_t offset,
                               int delayslot_size)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btgt = -1;
    int blink = 0;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
#ifdef MIPS_DEBUG_DISAS
        LOG_DISAS("Branch in delay / forbidden slot at PC 0x"
                  TARGET_FMT_lx "\n", ctx->base.pc_next);
#endif
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    /* Load needed operands */
    switch (opc) {
    case OPC_BEQ:
    case OPC_BEQL:
    case OPC_BNE:
    case OPC_BNEL:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BGEZ:
    case OPC_BGEZAL:
    case OPC_BGEZALL:
    case OPC_BGEZL:
    case OPC_BGTZ:
    case OPC_BGTZL:
    case OPC_BLEZ:
    case OPC_BLEZL:
    case OPC_BLTZ:
    case OPC_BLTZAL:
    case OPC_BLTZALL:
    case OPC_BLTZL:
        /* Compare to zero */
        if (rs != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BPOSGE32:
#if defined(TARGET_MIPS64)
    case OPC_BPOSGE64:
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x7F);
#else
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x3F);
#endif
        bcond_compute = 1;
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_J:
    case OPC_JAL:
    case OPC_JALX:
        /* Jump to immediate */
        btgt = ((ctx->base.pc_next + insn_bytes) & (int32_t)0xF0000000) |
            (uint32_t)offset;
        break;
    case OPC_JR:
    case OPC_JALR:
        /* Jump to register */
        if (offset != 0 && offset != 16) {
            /*
             * Hint = 0 is JR/JALR, hint 16 is JR.HB/JALR.HB, the
             * others are reserved.
             */
            MIPS_INVAL("jump hint");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
        gen_load_gpr(tcg_ctx, tcg_ctx->btarget, rs);
        break;
    default:
        MIPS_INVAL("branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    if (bcond_compute == 0) {
        /* No condition to be computed */
        switch (opc) {
        case OPC_BEQ:     /* rx == rx        */
        case OPC_BEQL:    /* rx == rx likely */
        case OPC_BGEZ:    /* 0 >= 0          */
        case OPC_BGEZL:   /* 0 >= 0 likely   */
        case OPC_BLEZ:    /* 0 <= 0          */
        case OPC_BLEZL:   /* 0 <= 0 likely   */
            /* Always take */
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BGEZAL:  /* 0 >= 0          */
        case OPC_BGEZALL: /* 0 >= 0 likely   */
            /* Always take and link */
            blink = 31;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BNE:     /* rx != rx        */
        case OPC_BGTZ:    /* 0 > 0           */
        case OPC_BLTZ:    /* 0 < 0           */
            /* Treat as NOP. */
            goto out;
        case OPC_BLTZAL:  /* 0 < 0           */
            /*
             * Handle as an unconditional branch to get correct delay
             * slot checking.
             */
            blink = 31;
            btgt = ctx->base.pc_next + insn_bytes + delayslot_size;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BLTZALL: /* 0 < 0 likely */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 8);
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_BNEL:    /* rx != rx likely */
        case OPC_BGTZL:   /* 0 > 0 likely */
        case OPC_BLTZL:   /* 0 < 0 likely */
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_J:
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_JALX:
            ctx->hflags |= MIPS_HFLAG_BX;
            /* Fallthrough */
        case OPC_JAL:
            blink = 31;
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_JR:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_JALR:
            blink = rt;
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        default:
            MIPS_INVAL("branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    } else {
        switch (opc) {
        case OPC_BEQ:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BEQL:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto likely;
        case OPC_BNE:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BNEL:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto likely;
        case OPC_BGEZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BGEZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BGEZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            blink = 31;
            goto not_likely;
        case OPC_BGEZALL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            blink = 31;
            goto likely;
        case OPC_BGTZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GT, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BGTZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GT, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BLEZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LE, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BLEZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LE, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BLTZ:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            goto not_likely;
        case OPC_BLTZL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            goto likely;
        case OPC_BPOSGE32:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 32);
            goto not_likely;
#if defined(TARGET_MIPS64)
        case OPC_BPOSGE64:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 64);
            goto not_likely;
#endif
        case OPC_BLTZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            blink = 31;
        not_likely:
            ctx->hflags |= MIPS_HFLAG_BC;
            break;
        case OPC_BLTZALL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->bcond, t0, 0);
            blink = 31;
        likely:
            ctx->hflags |= MIPS_HFLAG_BL;
            break;
        default:
            MIPS_INVAL("conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    }

    ctx->btarget = btgt;

    switch (delayslot_size) {
    case 2:
        ctx->hflags |= MIPS_HFLAG_BDS16;
        break;
    case 4:
        ctx->hflags |= MIPS_HFLAG_BDS32;
        break;
    }

    if (blink > 0) {
        int post_delay = insn_bytes + delayslot_size;
        int lowbit = !!(ctx->hflags & MIPS_HFLAG_M16);

        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[blink],
                        ctx->base.pc_next + post_delay + lowbit);
    }

 out:
    if (insn_bytes == 2) {
        ctx->hflags |= MIPS_HFLAG_B16;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}